

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

void oonf_packet_remove(oonf_packet_socket *pktsocket,_Bool force)

{
  list_entity *plVar1;
  list_entity *plVar2;
  os_fd *poVar3;
  bool bVar4;
  _Bool force_local;
  oonf_packet_socket *pktsocket_local;
  int result;
  
  bVar4 = false;
  if ((pktsocket->node).next != (list_entity *)0x0) {
    bVar4 = (pktsocket->node).prev != (list_entity *)0x0;
  }
  if (bVar4) {
    oonf_socket_remove(&pktsocket->scheduler_entry);
    poVar3 = &(pktsocket->scheduler_entry).fd;
    if (poVar3->fd != -1) {
      close(poVar3->fd);
      poVar3->fd = -1;
    }
    abuf_free(&pktsocket->out);
    plVar1 = (pktsocket->node).prev;
    plVar2 = (pktsocket->node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (pktsocket->node).prev = (list_entity *)0x0;
    (pktsocket->node).next = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_packet_remove(struct oonf_packet_socket *pktsocket, bool force __attribute__((unused))) {
  // TODO: implement non-force behavior for UDP sockets
  if (list_is_node_added(&pktsocket->node)) {
    oonf_socket_remove(&pktsocket->scheduler_entry);
    os_fd_close(&pktsocket->scheduler_entry.fd);
    abuf_free(&pktsocket->out);

    list_remove(&pktsocket->node);
  }
}